

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O3

void test_ptr<booster::clone_ptr<int>>(void)

{
  char cVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  clone_ptr<int> y;
  clone_ptr<int> x;
  archive a;
  ostringstream oss;
  clone_ptr<int> local_1f8;
  clone_ptr<int> local_1f0;
  string local_1e8 [32];
  archive local_1c8 [56];
  ostringstream local_190 [376];
  
  cppcms::archive::archive(local_1c8);
  local_1f0.ptr_ = (int *)operator_new(4);
  *local_1f0.ptr_ = 0xf;
  local_1f8.ptr_ = (int *)0x0;
  cppcms::operator&(local_1c8,&local_1f0);
  cppcms::archive::mode(local_1c8,1);
  cppcms::operator&(local_1c8,&local_1f8);
  if ((local_1f0.ptr_ == local_1f8.ptr_) || (*local_1f0.ptr_ != *local_1f8.ptr_)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," *x==*y && x.get()!=y.get()",0x1b);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a.eof()",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1f8.ptr_ != (int *)0x0) {
    operator_delete(local_1f8.ptr_);
  }
  if (local_1f0.ptr_ != (int *)0x0) {
    operator_delete(local_1f0.ptr_);
  }
  cppcms::archive::~archive(local_1c8);
  cppcms::archive::archive(local_1c8);
  local_1f0.ptr_ = (int *)operator_new(4);
  *local_1f0.ptr_ = 0xf;
  local_1f8.ptr_ = (int *)0x0;
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::save(&local_1f0,local_1c8);
  cppcms::archive::mode(local_1c8,1);
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::load(&local_1f8,local_1c8);
  if ((local_1f0.ptr_ == local_1f8.ptr_) || (*local_1f0.ptr_ != *local_1f8.ptr_)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x85);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," *x==*y && x.get()!=y.get()",0x1b);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x86);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a.eof()",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1f8.ptr_ != (int *)0x0) {
    operator_delete(local_1f8.ptr_);
  }
  if (local_1f0.ptr_ != (int *)0x0) {
    operator_delete(local_1f0.ptr_);
  }
  cppcms::archive::~archive(local_1c8);
  cppcms::archive::archive(local_1c8);
  local_1f0.ptr_ = (int *)0x0;
  local_1f8.ptr_ = (int *)operator_new(4);
  *local_1f8.ptr_ = 0xf;
  cppcms::operator&(local_1c8,&local_1f0);
  cppcms::archive::mode(local_1c8,1);
  cppcms::operator&(local_1c8,&local_1f8);
  if (local_1f8.ptr_ != (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x8f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," y.get()==0",0xb);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a.eof()",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1f8.ptr_ != (int *)0x0) {
    operator_delete(local_1f8.ptr_);
  }
  if (local_1f0.ptr_ != (int *)0x0) {
    operator_delete(local_1f0.ptr_);
  }
  cppcms::archive::~archive(local_1c8);
  cppcms::archive::archive(local_1c8);
  local_1f0.ptr_ = (int *)0x0;
  local_1f8.ptr_ = (int *)operator_new(4);
  *local_1f8.ptr_ = 0xf;
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::save(&local_1f0,local_1c8);
  cppcms::archive::mode(local_1c8,1);
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::load(&local_1f8,local_1c8);
  if (local_1f8.ptr_ == (int *)0x0) {
    cVar1 = cppcms::archive::eof();
    if (cVar1 != '\0') {
      if (local_1f8.ptr_ != (int *)0x0) {
        operator_delete(local_1f8.ptr_);
      }
      if (local_1f0.ptr_ != (int *)0x0) {
        operator_delete(local_1f0.ptr_);
      }
      cppcms::archive::~archive(local_1c8);
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x9a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a.eof()",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," y.get()==0",0xb);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1e8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_ptr()
{
	{
		cppcms::archive a;
		Pointer x(new int(15)),y;
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer const x(new int(15));
		Pointer y;
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer x,y(new int(15));
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(y.get()==0);
		TEST(a.eof());
	}
	{
		cppcms::archive a;
		Pointer const x;
		Pointer y(new int(15));
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(y.get()==0);
		TEST(a.eof());
	}

}